

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_facade.cpp
# Opt level: O2

void __thiscall Clasp::ClaspFacade::SolveStrategy::startAlgo(SolveStrategy *this,SolveMode_t m)

{
  ClaspFacade *onModel;
  bool more;
  double dVar1;
  
  (*this->_vptr_SolveStrategy[4])();
  ClaspFacade::interrupt(this->facade_,0);
  if (((this->signal_).super___atomic_base<unsigned_int>._M_i == 0) &&
     (((*(this->facade_->ctx).solvers_.ebo_.buf)->conflict_).ebo_.size == 0)) {
    dVar1 = RealTime::getTime();
    onModel = this->facade_;
    (onModel->step_).unsatTime = dVar1;
    (onModel->step_).solveTime = dVar1;
    if ((m.val_ & Yield) != Default) {
      SolveAlgorithm::start
                (this->algo_,&onModel->ctx,&onModel->assume_,&onModel->super_ModelHandler);
      return;
    }
    more = SolveAlgorithm::solve
                     (this->algo_,&onModel->ctx,&onModel->assume_,&onModel->super_ModelHandler);
  }
  else {
    SharedContext::report(&this->facade_->ctx,subsystem_solve);
    more = SharedContext::ok(&this->facade_->ctx);
  }
  detachAlgo(this,more,0,0);
  return;
}

Assistant:

void ClaspFacade::SolveStrategy::startAlgo(SolveMode_t m) {
	bool more = true, detach = true;
	doNotify(event_attach);
	try {
		facade_->interrupt(0); // handle pending interrupts
		if (!signal_ && !facade_->ctx.master()->hasConflict()) {
			facade_->step_.solveTime = facade_->step_.unsatTime = RealTime::getTime();
			if ((m & SolveMode_t::Yield) == 0) {
				more = algo_->solve(facade_->ctx, facade_->assume_, facade_);
			}
			else {
				algo_->start(facade_->ctx, facade_->assume_, facade_);
				detach = false;
			}
		}
		else {
			facade_->ctx.report(Clasp::Event::subsystem_solve);
			more = facade_->ctx.ok();
		}
		if (detach) { detach = false; detachAlgo(more, 0); }
	}
	catch (...) {
		if (detach) { detachAlgo(more, 1); }
		else        { throw; }
	}
}